

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
helics::FederateInfo::loadInfoFromArgs_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,FederateInfo *this,int argc,char **argv)

{
  ParseOutput PVar1;
  HelicsException *this_00;
  string_view message;
  helicsCLI11App *local_40;
  int local_34;
  pointer local_30;
  
  local_34 = argc;
  local_30 = (pointer)argv;
  makeCLIApp((FederateInfo *)&stack0xffffffffffffffc0);
  PVar1 = helicsCLI11App::helics_parse<int&,char**&>
                    (local_40,&stack0xffffffffffffffcc,(char ***)&stack0xffffffffffffffd0);
  if (PVar1 != PARSE_ERROR) {
    config_additional(this,&local_40->super_App);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__return_storage_ptr__,&local_40->remArgs);
    if (local_40 != (helicsCLI11App *)0x0) {
      (*(local_40->super_App)._vptr_App[1])();
    }
    return __return_storage_ptr__;
  }
  this_00 = (HelicsException *)__cxa_allocate_exception(0x28);
  message._M_str = "argument parsing failed";
  message._M_len = 0x17;
  HelicsException::HelicsException(this_00,message);
  *(undefined ***)this_00 = &PTR__HelicsException_004caa00;
  __cxa_throw(this_00,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
}

Assistant:

std::vector<std::string> FederateInfo::loadInfoFromArgs(int argc, char* argv[])
{
    auto app = makeCLIApp();
    auto ret = app->helics_parse(argc, argv);
    if (ret == helicsCLI11App::ParseOutput::PARSE_ERROR) {
        throw helics::InvalidParameter("argument parsing failed");
    }
    config_additional(app.get());
    return app->remainArgs();
}